

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

void __thiscall
duckdb::SubqueryExpression::Serialize(SubqueryExpression *this,Serializer *serializer)

{
  ParsedExpression::Serialize(&this->super_ParsedExpression,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"subquery_type");
  Serializer::WriteValue<duckdb::SubqueryType>(serializer,this->subquery_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
            (serializer,0xc9,"subquery",&this->subquery);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xca,"child",&this->child);
  (*serializer->_vptr_Serializer[2])(serializer,0xcb,"comparison_type");
  Serializer::WriteValue<duckdb::ExpressionType>(serializer,this->comparison_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void SubqueryExpression::Serialize(Serializer &serializer) const {
	ParsedExpression::Serialize(serializer);
	serializer.WriteProperty<SubqueryType>(200, "subquery_type", subquery_type);
	serializer.WritePropertyWithDefault<unique_ptr<SelectStatement>>(201, "subquery", subquery);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(202, "child", child);
	serializer.WriteProperty<ExpressionType>(203, "comparison_type", comparison_type);
}